

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name)

{
  string *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string local_48;
  
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.m_rc = 0;
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_001b0578;
  __return_storage_ptr__ = &this->m_name;
  toLower(__return_storage_ptr__,name);
  this->m_wildcard = NoWildcard;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*","");
  bVar2 = startsWith(__return_storage_ptr__,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    this->m_wildcard = WildcardAtStart;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*","");
  bVar2 = endsWith(__return_storage_ptr__,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    *(undefined1 *)&this->m_wildcard = (char)this->m_wildcard | WildcardAtEnd;
  }
  return;
}

Assistant:

NamePattern( std::string const& name ) : m_name( toLower( name ) ), m_wildcard( NoWildcard ) {
                if( startsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 1 );
                    m_wildcard = WildcardAtStart;
                }
                if( endsWith( m_name, "*" ) ) {
                    m_name = m_name.substr( 0, m_name.size()-1 );
                    m_wildcard = static_cast<WildcardPosition>( m_wildcard | WildcardAtEnd );
                }
            }